

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void SubtractionHelper<unsigned_long,int,15>::
     SubtractThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (unsigned_long *lhs,int *rhs,int *result)

{
  code *pcVar1;
  uint32_t uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int *in_RDX;
  int *in_RSI;
  ulong *in_RDI;
  uint64_t tmp_1;
  uint64_t tmp;
  
  if (*in_RSI < 0) {
    uVar5 = *in_RDI;
    uVar2 = AbsValueHelper<int,_0>::Abs(0);
    uVar5 = uVar5 + uVar2;
    if ((uVar5 < *in_RDI) || (iVar3 = std::numeric_limits<int>::max(), (ulong)(long)iVar3 < uVar5))
    {
LAB_001d24dd:
      safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
    }
    *in_RDX = (int)uVar5;
  }
  else if (*in_RDI < (ulong)(long)*in_RSI) {
    if (SBORROW4((int)*in_RDI,*in_RSI)) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *in_RDX = (int)*in_RDI - *in_RSI;
  }
  else {
    uVar5 = *in_RDI;
    iVar3 = *in_RSI;
    iVar4 = std::numeric_limits<int>::max();
    if ((ulong)(long)iVar4 < uVar5 - (long)iVar3) goto LAB_001d24dd;
    *in_RDX = (int)(uVar5 - (long)iVar3);
  }
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void SubtractThrow( const U& lhs, const T& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // U is std::uint64_t, T is signed
        if( rhs < 0 )
        {
            // treat this as addition
            std::uint64_t tmp = 0;

            tmp = lhs + (std::uint64_t)AbsValueHelper< T, GetAbsMethod< T >::method >::Abs( rhs );

            // must check for addition overflow and max
            if( tmp >= lhs && tmp <= (std::uint64_t)std::numeric_limits<T>::max() )
            {
                result = (T)tmp;
                return;
            }
        }
        else if( (std::uint64_t)rhs > lhs ) // now both are positive, so comparison always works
        {
            // result is negative
            // implies that lhs must fit into T, and result cannot overflow
            // Also allows us to drop to 32-bit math, which is faster on a 32-bit system
            result = (T)lhs - (T)rhs;
            return;
        }
        else
        {
            // result is positive
            std::uint64_t tmp = (std::uint64_t)lhs - (std::uint64_t)rhs;

            if( tmp <= (std::uint64_t)std::numeric_limits<T>::max() )
            {
                result = (T)tmp;
                return;
            }
        }

        E::SafeIntOnOverflow();
    }